

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FastAllocator *pFVar6;
  __uniq_ptr_data<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>,_true,_true>
  this_00;
  iterator __position;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  ThreadLocal *pTVar7;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar8;
  char cVar9;
  uint uVar10;
  long *plVar11;
  ThreadLocal2 *this_01;
  long lVar12;
  undefined1 (*pauVar13) [16];
  int *piVar14;
  size_t sVar15;
  runtime_error *this_02;
  int iVar16;
  int iVar17;
  ulong uVar18;
  MutexSys *pMVar19;
  uint uVar20;
  ulong uVar21;
  size_t *psVar22;
  uint uVar23;
  uint uVar24;
  size_type sVar25;
  range<unsigned_int> *prVar26;
  char *pcVar27;
  MutexSys *pMVar28;
  undefined1 auVar29 [16];
  task_group_context context;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  auto_partitioner local_2f9;
  size_t local_2f8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  blocked_range<unsigned_long> local_2d0;
  range<unsigned_int> local_2b8;
  range<unsigned_int> local_2b0 [7];
  undefined1 local_278 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_258 [2];
  string_resource_index local_238;
  undefined1 local_1f8 [16];
  anon_class_32_4_e5015336 local_1e0;
  anon_class_8_1_898bcfc2 local_1c0;
  ThreadLocal2 local_1b8 [2];
  
  local_2f8 = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    local_2e8 = (undefined1  [8])this;
    pFVar6 = (this->createAllocator->super_Create).allocator;
    plVar11 = (long *)__tls_get_addr(&PTR_02224d38);
    this_01 = (ThreadLocal2 *)*plVar11;
    if (this_01 == (ThreadLocal2 *)0x0) {
      this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)this_01);
      (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_01->alloc0).parent = this_01;
      (this_01->alloc0).ptr = (char *)0x0;
      (this_01->alloc0).cur = 0;
      (this_01->alloc0).end = 0;
      (this_01->alloc0).allocBlockSize = 0;
      (this_01->alloc0).bytesUsed = 0;
      (this_01->alloc0).bytesWasted = 0;
      (this_01->alloc1).parent = this_01;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      *plVar11 = (long)this_01;
      local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
      local_1b8[0].alloc._M_b._M_p._0_1_ = '\x01';
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_278._0_8_ = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_278);
      if ((ThreadLocal2 *)local_278._0_8_ != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_278,
                   (ThreadLocal2 *)local_278._0_8_);
      }
      if ((char)local_1b8[0].alloc._M_b._M_p == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
      }
    }
    alloc.talloc0 = &this_01->alloc0;
    alloc.talloc1 = &this_01->alloc1;
    if (pFVar6->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    this = (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
            *)local_2e8;
    alloc.alloc = pFVar6;
  }
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  if ((this->super_Settings).maxDepth <= local_2f8 + 8) {
LAB_00cc391c:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,local_2f8,current,alloc_01);
    return __return_storage_ptr__;
  }
  if ((ulong)(current->_end - current->_begin) <= (this->super_Settings).minLeafSize)
  goto LAB_00cc391c;
  uVar20 = this->morton[current->_begin].field_0.field_0.code;
  uVar10 = this->morton[current->_end - 1].field_0.field_0.code;
  if (uVar20 == uVar10) {
    iVar16 = 0x20;
  }
  else {
    uVar10 = uVar10 ^ uVar20;
    iVar16 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    iVar16 = 0x1f - iVar16;
  }
  local_2f0 = __return_storage_ptr__;
  if (iVar16 == 0x20) {
    recreateMortonCodes(this,current);
    uVar10 = current->_begin;
    uVar20 = current->_end;
    uVar23 = this->morton[uVar10].field_0.field_0.code;
    uVar24 = this->morton[uVar20 - 1].field_0.field_0.code;
    if (uVar23 == uVar24) {
      iVar16 = 0x20;
    }
    else {
      uVar24 = uVar24 ^ uVar23;
      iVar16 = 0x1f;
      if (uVar24 != 0) {
        for (; uVar24 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      iVar16 = 0x1f - iVar16;
    }
    if (iVar16 != 0x20) goto LAB_00cc32b4;
    uVar23 = uVar20 + uVar10 >> 1;
    uVar18 = (ulong)uVar23;
    local_2b8._end = uVar23;
    local_2b8._begin = uVar10;
  }
  else {
LAB_00cc32b4:
    uVar10 = current->_begin;
    uVar21 = (ulong)uVar10;
    uVar20 = current->_end;
    uVar18 = (ulong)uVar20;
    if (uVar10 + 1 != uVar20) {
      uVar23 = uVar20;
      do {
        uVar24 = uVar23 + uVar10 >> 1;
        uVar18 = (ulong)uVar24;
        if ((this->morton[uVar18].field_0.field_0.code & 0x80000000U >> ((byte)iVar16 & 0x1f)) == 0)
        {
          uVar18 = (ulong)uVar23;
          uVar10 = uVar24;
        }
        uVar23 = (uint)uVar18;
      } while (uVar10 + 1 != uVar23);
    }
    local_2b8 = (range<unsigned_int>)(uVar18 << 0x20 | uVar21);
  }
  local_2b0[0] = (range<unsigned_int>)((ulong)uVar20 << 0x20 | uVar18);
  pMVar28 = (MutexSys *)0x2;
  do {
    if ((MutexSys *)(this->super_Settings).branchingFactor <= pMVar28) break;
    if (pMVar28 == (MutexSys *)0x0) {
      iVar16 = -1;
    }
    else {
      uVar18 = 0;
      uVar21 = 0xffffffff;
      uVar20 = 0;
      do {
        uVar10 = (&local_2b8)[uVar18]._end - local_2b0[uVar18 - 1]._begin;
        if ((this->super_Settings).minLeafSize < (ulong)uVar10 && uVar20 < uVar10) {
          uVar21 = uVar18 & 0xffffffff;
          uVar20 = uVar10;
        }
        iVar16 = (int)uVar21;
        uVar18 = uVar18 + 1;
      } while ((MutexSys *)(uVar18 & 0xffffffff) < pMVar28);
    }
    if (iVar16 != -1) {
      uVar20 = this->morton[local_2b0[(long)iVar16 + -1]._begin].field_0.field_0.code;
      uVar10 = this->morton[(&local_2b8)[iVar16]._end - 1].field_0.field_0.code;
      if (uVar20 == uVar10) {
        iVar17 = 0x20;
      }
      else {
        uVar10 = uVar10 ^ uVar20;
        iVar17 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar17 == 0; iVar17 = iVar17 + -1) {
          }
        }
        iVar17 = 0x1f - iVar17;
      }
      prVar26 = local_2b0 + (long)iVar16 + -1;
      if (iVar17 == 0x20) {
        recreateMortonCodes(this,prVar26);
        uVar10 = prVar26->_begin;
        uVar20 = (&local_2b8)[iVar16]._end;
        uVar23 = this->morton[uVar10].field_0.field_0.code;
        uVar24 = this->morton[uVar20 - 1].field_0.field_0.code;
        if (uVar23 == uVar24) {
          iVar17 = 0x20;
        }
        else {
          uVar24 = uVar24 ^ uVar23;
          iVar17 = 0x1f;
          if (uVar24 != 0) {
            for (; uVar24 >> iVar17 == 0; iVar17 = iVar17 + -1) {
            }
          }
          iVar17 = 0x1f - iVar17;
        }
        if (iVar17 != 0x20) goto LAB_00cc33a4;
        uVar23 = uVar20 + uVar10 >> 1;
        uVar18 = (ulong)uVar23;
        sVar25 = CONCAT44(uVar23,uVar10);
      }
      else {
LAB_00cc33a4:
        uVar10 = prVar26->_begin;
        uVar21 = (ulong)uVar10;
        uVar20 = (&local_2b8)[iVar16]._end;
        uVar18 = (ulong)uVar20;
        if (uVar10 + 1 != uVar20) {
          uVar23 = uVar20;
          do {
            uVar24 = uVar23 + uVar10 >> 1;
            uVar18 = (ulong)uVar24;
            if ((this->morton[uVar18].field_0.field_0.code & 0x80000000U >> ((byte)iVar17 & 0x1f))
                == 0) {
              uVar18 = (ulong)uVar23;
              uVar10 = uVar24;
            }
            uVar23 = (uint)uVar18;
          } while (uVar10 + 1 != uVar23);
        }
        sVar25 = uVar18 << 0x20 | uVar21;
      }
      *prVar26 = *(range<unsigned_int> *)(&local_2d0.my_grainsize + (long)pMVar28);
      (&local_2d0.my_grainsize)[(long)pMVar28] = sVar25;
      local_2b0[(long)((long)&pMVar28[-1].mutex + 7)] =
           (range<unsigned_int>)((ulong)uVar20 << 0x20 | uVar18);
      pMVar28 = (MutexSys *)((long)&pMVar28->mutex + 1);
    }
  } while (iVar16 != -1);
  pBVar8 = local_2f0;
  pTVar7 = alloc.talloc0;
  pFVar6 = alloc.alloc;
  if (pMVar28 == (MutexSys *)0x1) {
    CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
              (local_2f0,this->createLeaf,current,&alloc);
    return pBVar8;
  }
  local_2d0.my_end = 0x80;
  this_00.
  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
       (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
        )(alloc.talloc0)->parent;
  if (alloc.alloc !=
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_00.
              super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p) {
    local_278[8] = '\x01';
    local_278._0_8_ =
         this_00.
         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         ._M_t.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)
                   this_00.
                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
                  );
    if ((((atomic<embree::FastAllocator_*> *)
         ((long)this_00.
                super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                ._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         8))->_M_b)._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xa8) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x68);
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)this_00.
                                    super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    .
                                    super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                    ._M_head_impl + 0x58) +
            (long)*(void **)((long)this_00.
                                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x98)) -
           ((long)*(void **)((long)this_00.
                                   super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x50) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x90)));
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xb0) +
           (long)*(void **)((long)this_00.
                                  super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x70);
      UNLOCK();
    }
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x68) = (void *)0x0;
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x70) = (void *)0x0;
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x58) = (void *)0x0;
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x60) = (void *)0x0;
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x48) = (void *)0x0;
    *(void **)((long)this_00.
                     super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x50) = (void *)0x0;
    if (pFVar6 == (FastAllocator *)0x0) {
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
    }
    else {
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = (void *)pFVar6->defaultBlockSize;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      *(void **)((long)this_00.
                       super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)pFVar6->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)
     ((long)this_00.
            super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8))
    ->_M_b)._M_p = pFVar6;
    UNLOCK();
    local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_1b8[0].alloc._M_b._M_p._0_1_ = '\x01';
    local_1e0.bounds =
         (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])
         this_00.
         super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         ._M_t.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar6->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar6->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar6->thread_local_allocators,__position,(ThreadLocal2 **)&local_1e0);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_1e0.bounds;
      pppTVar2 = &(pFVar6->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)local_1b8[0].alloc._M_b._M_p == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
    }
    if (local_278[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_278._0_8_);
    }
  }
  pTVar7->bytesUsed = (long)(void **)local_2d0.my_end + pTVar7->bytesUsed;
  sVar15 = pTVar7->cur;
  uVar18 = (ulong)(-(int)sVar15 & 0xf);
  uVar21 = (long)(void **)local_2d0.my_end + uVar18 + sVar15;
  pTVar7->cur = uVar21;
  if (pTVar7->end < uVar21) {
    pTVar7->cur = sVar15;
    if ((MutexSys *)pTVar7->allocBlockSize < (MutexSys *)(local_2d0.my_end << 2)) {
      pcVar27 = (char *)FastAllocator::malloc(pFVar6,(size_t)&local_2d0);
    }
    else {
      local_1b8[0].mutex.mutex = (MutexSys *)pTVar7->allocBlockSize;
      pcVar27 = (char *)FastAllocator::malloc(pFVar6,(size_t)local_1b8);
      pTVar7->ptr = pcVar27;
      sVar15 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar15;
      pTVar7->cur = 0;
      pTVar7->end = (size_t)local_1b8[0].mutex.mutex;
      pTVar7->cur = local_2d0.my_end;
      if (local_1b8[0].mutex.mutex < local_2d0.my_end) {
        pTVar7->cur = 0;
        local_1b8[0].mutex.mutex = (void *)pTVar7->allocBlockSize;
        pcVar27 = (char *)FastAllocator::malloc(pFVar6,(size_t)local_1b8);
        pTVar7->ptr = pcVar27;
        sVar15 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar15;
        pTVar7->cur = 0;
        pTVar7->end = (size_t)local_1b8[0].mutex.mutex;
        pTVar7->cur = local_2d0.my_end;
        if (local_1b8[0].mutex.mutex < local_2d0.my_end) {
          pTVar7->cur = 0;
          pcVar27 = (char *)0x0;
          goto LAB_00cc3645;
        }
      }
      pTVar7->bytesWasted = sVar15;
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar18;
    pcVar27 = pTVar7->ptr + (uVar21 - local_2d0.my_end);
  }
LAB_00cc3645:
  pcVar27[0x60] = '\0';
  pcVar27[0x61] = '\0';
  pcVar27[0x62] = -0x80;
  pcVar27[99] = '\x7f';
  pcVar27[100] = '\0';
  pcVar27[0x65] = '\0';
  pcVar27[0x66] = -0x80;
  pcVar27[0x67] = '\x7f';
  pcVar27[0x68] = '\0';
  pcVar27[0x69] = '\0';
  pcVar27[0x6a] = -0x80;
  pcVar27[0x6b] = '\x7f';
  pcVar27[0x6c] = '\0';
  pcVar27[0x6d] = '\0';
  pcVar27[0x6e] = -0x80;
  pcVar27[0x6f] = '\x7f';
  pcVar27[0x40] = '\0';
  pcVar27[0x41] = '\0';
  pcVar27[0x42] = -0x80;
  pcVar27[0x43] = '\x7f';
  pcVar27[0x44] = '\0';
  pcVar27[0x45] = '\0';
  pcVar27[0x46] = -0x80;
  pcVar27[0x47] = '\x7f';
  pcVar27[0x48] = '\0';
  pcVar27[0x49] = '\0';
  pcVar27[0x4a] = -0x80;
  pcVar27[0x4b] = '\x7f';
  pcVar27[0x4c] = '\0';
  pcVar27[0x4d] = '\0';
  pcVar27[0x4e] = -0x80;
  pcVar27[0x4f] = '\x7f';
  pcVar27[0x20] = '\0';
  pcVar27[0x21] = '\0';
  pcVar27[0x22] = -0x80;
  pcVar27[0x23] = '\x7f';
  pcVar27[0x24] = '\0';
  pcVar27[0x25] = '\0';
  pcVar27[0x26] = -0x80;
  pcVar27[0x27] = '\x7f';
  pcVar27[0x28] = '\0';
  pcVar27[0x29] = '\0';
  pcVar27[0x2a] = -0x80;
  pcVar27[0x2b] = '\x7f';
  pcVar27[0x2c] = '\0';
  pcVar27[0x2d] = '\0';
  pcVar27[0x2e] = -0x80;
  pcVar27[0x2f] = '\x7f';
  pcVar27[0x70] = '\0';
  pcVar27[0x71] = '\0';
  pcVar27[0x72] = -0x80;
  pcVar27[0x73] = -1;
  pcVar27[0x74] = '\0';
  pcVar27[0x75] = '\0';
  pcVar27[0x76] = -0x80;
  pcVar27[0x77] = -1;
  pcVar27[0x78] = '\0';
  pcVar27[0x79] = '\0';
  pcVar27[0x7a] = -0x80;
  pcVar27[0x7b] = -1;
  pcVar27[0x7c] = '\0';
  pcVar27[0x7d] = '\0';
  pcVar27[0x7e] = -0x80;
  pcVar27[0x7f] = -1;
  pcVar27[0x50] = '\0';
  pcVar27[0x51] = '\0';
  pcVar27[0x52] = -0x80;
  pcVar27[0x53] = -1;
  pcVar27[0x54] = '\0';
  pcVar27[0x55] = '\0';
  pcVar27[0x56] = -0x80;
  pcVar27[0x57] = -1;
  pcVar27[0x58] = '\0';
  pcVar27[0x59] = '\0';
  pcVar27[0x5a] = -0x80;
  pcVar27[0x5b] = -1;
  pcVar27[0x5c] = '\0';
  pcVar27[0x5d] = '\0';
  pcVar27[0x5e] = -0x80;
  pcVar27[0x5f] = -1;
  pcVar27[0x30] = '\0';
  pcVar27[0x31] = '\0';
  pcVar27[0x32] = -0x80;
  pcVar27[0x33] = -1;
  pcVar27[0x34] = '\0';
  pcVar27[0x35] = '\0';
  pcVar27[0x36] = -0x80;
  pcVar27[0x37] = -1;
  pcVar27[0x38] = '\0';
  pcVar27[0x39] = '\0';
  pcVar27[0x3a] = -0x80;
  pcVar27[0x3b] = -1;
  pcVar27[0x3c] = '\0';
  pcVar27[0x3d] = '\0';
  pcVar27[0x3e] = -0x80;
  pcVar27[0x3f] = -1;
  lVar12 = 0;
  do {
    pcVar3 = pcVar27 + lVar12 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    lVar12 = lVar12 + 2;
  } while (lVar12 != 4);
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1e0.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])local_1b8;
    local_1e0.depth = &local_2f8;
    local_1e0.children = (range<unsigned_int> (*) [8])&local_2b8;
    local_278[0xc] = proxy_support;
    local_278[0xd] = (context_traits)0x4;
    local_258[0]._0_8_ = (intrusive_list_node *)0x0;
    local_258[0]._8_8_ = (intrusive_list_node *)0x0;
    local_238 = CUSTOM_CTX;
    local_1e0.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize((task_group_context *)local_278);
    local_2d0.my_begin = 0;
    local_2d0.my_grainsize = 1;
    local_2d0.my_end = (unsigned_long)pMVar28;
    local_1c0.func = &local_1e0;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_2d0,&local_1c0,&local_2f9,(task_group_context *)local_278);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_278);
    if (cVar9 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_278);
  }
  else {
    auVar29 = _DAT_01feb9f0;
    local_1f8 = _DAT_01feba00;
    if (pMVar28 == (MutexSys *)0x0) goto LAB_00cc3867;
    prVar26 = &local_2b8;
    psVar22 = (size_t *)&local_1b8[0].field_0x20;
    pMVar19 = pMVar28;
    do {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_278,this,local_2f8 + 1,prVar26,alloc_00
              ,false);
      (((ThreadLocal2 *)(psVar22 + -4))->mutex).mutex = (void *)local_278._0_8_;
      *(undefined8 *)(psVar22 + -2) = local_278._16_8_;
      psVar22[-1] = local_278._24_8_;
      *psVar22 = local_258[0]._0_8_;
      psVar22[1] = local_258[0]._8_8_;
      psVar22 = psVar22 + 6;
      prVar26 = prVar26 + 1;
      pMVar19 = (MutexSys *)((long)&pMVar19[-1].mutex + 7);
    } while (pMVar19 != (MutexSys *)0x0);
  }
  auVar29 = _DAT_01feb9f0;
  local_1f8 = _DAT_01feba00;
  if (pMVar28 != (MutexSys *)0x0) {
    pauVar13 = (undefined1 (*) [16])&local_1b8[0].field_0x20;
    pMVar19 = (MutexSys *)0x0;
    do {
      auVar4 = pauVar13[-1];
      auVar5 = *pauVar13;
      auVar29 = minps(auVar29,auVar4);
      local_1f8 = maxps(local_1f8,auVar5);
      *(undefined8 *)(pcVar27 + (long)pMVar19 * 8) = *(undefined8 *)pauVar13[-2];
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x20) = auVar4._0_4_;
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x40) = auVar4._4_4_;
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x60) = auVar4._8_4_;
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x30) = auVar5._0_4_;
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x50) = auVar5._4_4_;
      *(int *)(pcVar27 + (long)pMVar19 * 4 + 0x70) = auVar5._8_4_;
      pMVar19 = (MutexSys *)((long)&pMVar19->mutex + 1);
      pauVar13 = pauVar13 + 3;
    } while (pMVar28 != pMVar19);
  }
LAB_00cc3867:
  _local_2e8 = auVar29._0_12_;
  if (pMVar28 == (MutexSys *)0x0) {
    uVar18 = 0;
  }
  else {
    piVar14 = (int *)&local_1b8[0].field_0x1c;
    uVar18 = 0;
    pMVar19 = pMVar28;
    do {
      uVar18 = uVar18 + (long)*piVar14;
      piVar14 = piVar14 + 0xc;
      pMVar19 = (MutexSys *)((long)&pMVar19[-1].mutex + 7);
    } while (pMVar19 != (MutexSys *)0x0);
  }
  if ((0xfff < uVar18) && (pMVar28 != (MutexSys *)0x0)) {
    piVar14 = (int *)&local_1b8[0].field_0x1c;
    pMVar19 = (MutexSys *)0x0;
    _local_2e8 = auVar29;
    do {
      if (*piVar14 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar27 + (long)pMVar19 * 8),1);
        pcVar27[(long)pMVar19 * 8 + 7] = pcVar27[(long)pMVar19 * 8 + 7] | 0x80;
      }
      pMVar19 = (MutexSys *)((long)&pMVar19->mutex + 1);
      piVar14 = piVar14 + 0xc;
    } while (pMVar28 != pMVar19);
  }
  (local_2f0->ref).ptr = (size_t)pcVar27;
  (local_2f0->bounds).lower.field_0.m128[0] = (float)local_2e8._0_4_;
  (local_2f0->bounds).lower.field_0.m128[1] = (float)local_2e8._4_4_;
  (local_2f0->bounds).lower.field_0.m128[2] = fStack_2e0;
  (local_2f0->bounds).lower.field_0.m128[3] = (float)uVar18;
  *(undefined8 *)&(local_2f0->bounds).upper.field_0 = local_1f8._0_8_;
  *(undefined8 *)((long)&(local_2f0->bounds).upper.field_0 + 8) = local_1f8._8_8_;
  return local_2f0;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }